

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

int racial_exception(monst *mon,obj *obj)

{
  permonst *ppVar1;
  permonst *ptr;
  obj *obj_local;
  monst *mon_local;
  
  ppVar1 = raceptr(mon);
  if ((ppVar1 == mons + 0x2c) &&
     ((((obj->otyp == 0x48 || (obj->otyp == 0x70)) || (obj->otyp == 0x7d)) ||
      ((obj->otyp == 0x89 || (obj->otyp == 0x99)))))) {
    mon_local._4_4_ = 1;
  }
  else {
    mon_local._4_4_ = 0;
  }
  return mon_local._4_4_;
}

Assistant:

int racial_exception(struct monst *mon, struct obj *obj)
{
    const struct permonst *ptr = raceptr(mon);

    /* Acceptable Exceptions: */
    /* Allow hobbits to wear elven armor - LoTR */
    if (ptr == &mons[PM_HOBBIT] && is_elven_armor(obj))
	return 1;
    /* Unacceptable Exceptions: */
    /* Checks for object that certain races should never use go here */
    /*	return -1; */

    return 0;
}